

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaAllocator_T::CalculateStatistics(VmaAllocator_T *this,VmaTotalStatistics *pStats)

{
  undefined8 *puVar1;
  uint uVar2;
  ItemType *this_00;
  VmaDetailedStatistics *inoutStats;
  ulong uVar3;
  long lVar4;
  uint32_t memTypeIndex;
  ulong uVar5;
  VmaTotalStatistics *pVVar6;
  VmaDetailedStatistics *src;
  VmaBlockVector *blockVector;
  PoolList *pPVar7;
  VmaDedicatedAllocationList *this_01;
  uint32_t memTypeIndex_1;
  VmaMutexLockRead lock;
  VmaMutexLockRead local_40;
  VmaDetailedStatistics *local_38;
  
  *(undefined8 *)((long)&(pStats->total).statistics.blockBytes + 4) = 0;
  *(undefined8 *)((long)&(pStats->total).statistics.allocationBytes + 4) = 0;
  (pStats->total).statistics.blockCount = 0;
  (pStats->total).statistics.allocationCount = 0;
  (pStats->total).statistics.blockBytes = 0;
  (pStats->total).allocationSizeMin = 0xffffffffffffffff;
  (pStats->total).allocationSizeMax = 0;
  (pStats->total).unusedRangeSizeMin = 0xffffffffffffffff;
  (pStats->total).unusedRangeSizeMax = 0;
  local_38 = &pStats->total;
  for (lVar4 = 0; lVar4 != 0x800; lVar4 = lVar4 + 0x40) {
    puVar1 = (undefined8 *)((long)&pStats->memoryType[0].statistics.blockBytes + lVar4 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pStats->memoryType[0].statistics.blockCount + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pStats->memoryType[0].allocationSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryType[0].allocationSizeMax + lVar4) = 0;
    *(undefined8 *)((long)&pStats->memoryType[0].unusedRangeSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryType[0].unusedRangeSizeMax + lVar4) = 0;
  }
  src = pStats->memoryHeap;
  for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 0x40) {
    puVar1 = (undefined8 *)((long)&pStats->memoryHeap[0].statistics.blockBytes + lVar4 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pStats->memoryHeap[0].statistics.blockCount + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pStats->memoryHeap[0].allocationSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryHeap[0].allocationSizeMax + lVar4) = 0;
    *(undefined8 *)((long)&pStats->memoryHeap[0].unusedRangeSizeMin + lVar4) = 0xffffffffffffffff;
    *(undefined8 *)((long)&pStats->memoryHeap[0].unusedRangeSizeMax + lVar4) = 0;
  }
  pVVar6 = pStats;
  for (uVar5 = 0; uVar5 < (this->m_MemProps).memoryTypeCount; uVar5 = uVar5 + 1) {
    if (this->m_pBlockVectors[uVar5] != (VmaBlockVector *)0x0) {
      VmaBlockVector::AddDetailedStatistics(this->m_pBlockVectors[uVar5],pVVar6->memoryType);
    }
    pVVar6 = (VmaTotalStatistics *)(pVVar6->memoryType + 1);
  }
  local_40.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    local_40.m_pMutex = &this->m_PoolsMutex;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_PoolsMutex);
  }
  pPVar7 = &this->m_Pools;
  while (this_00 = pPVar7->m_Front, this_00 != (ItemType *)0x0) {
    uVar2 = (this_00->m_BlockVector).m_MemoryTypeIndex;
    VmaBlockVector::AddDetailedStatistics(&this_00->m_BlockVector,pStats->memoryType + uVar2);
    VmaDedicatedAllocationList::AddDetailedStatistics
              (&this_00->m_DedicatedAllocations,pStats->memoryType + uVar2);
    pPVar7 = (PoolList *)&this_00->m_NextPool;
  }
  VmaMutexLockRead::~VmaMutexLockRead(&local_40);
  this_01 = this->m_DedicatedAllocations;
  pVVar6 = pStats;
  for (uVar5 = 0; uVar3 = (ulong)(this->m_MemProps).memoryTypeCount, uVar5 < uVar3;
      uVar5 = uVar5 + 1) {
    VmaDedicatedAllocationList::AddDetailedStatistics(this_01,pVVar6->memoryType);
    this_01 = this_01 + 1;
    pVVar6 = (VmaTotalStatistics *)(pVVar6->memoryType + 1);
  }
  for (uVar5 = 0; inoutStats = local_38, uVar5 < uVar3; uVar5 = uVar5 + 1) {
    VmaAddDetailedStatistics
              (src + (this->m_MemProps).memoryTypes[uVar5].heapIndex,pStats->memoryType);
    uVar3 = (ulong)(this->m_MemProps).memoryTypeCount;
    pStats = (VmaTotalStatistics *)(pStats->memoryType + 1);
  }
  for (uVar5 = 0; uVar5 < (this->m_MemProps).memoryHeapCount; uVar5 = uVar5 + 1) {
    VmaAddDetailedStatistics(inoutStats,src);
    src = src + 1;
  }
  return;
}

Assistant:

void VmaAllocator_T::CalculateStatistics(VmaTotalStatistics* pStats)
{
    // Initialize.
    VmaClearDetailedStatistics(pStats->total);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_TYPES; ++i)
        VmaClearDetailedStatistics(pStats->memoryType[i]);
    for(uint32_t i = 0; i < VK_MAX_MEMORY_HEAPS; ++i)
        VmaClearDetailedStatistics(pStats->memoryHeap[i]);

    // Process default pools.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        VmaBlockVector* const pBlockVector = m_pBlockVectors[memTypeIndex];
        if (pBlockVector != VMA_NULL)
            pBlockVector->AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Process custom pools.
    {
        VmaMutexLockRead lock(m_PoolsMutex, m_UseMutex);
        for(VmaPool pool = m_Pools.Front(); pool != VMA_NULL; pool = m_Pools.GetNext(pool))
        {
            VmaBlockVector& blockVector = pool->m_BlockVector;
            const uint32_t memTypeIndex = blockVector.GetMemoryTypeIndex();
            blockVector.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
            pool->m_DedicatedAllocations.AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
        }
    }

    // Process dedicated allocations.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        m_DedicatedAllocations[memTypeIndex].AddDetailedStatistics(pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory types to memory heaps.
    for(uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
    {
        const uint32_t memHeapIndex = m_MemProps.memoryTypes[memTypeIndex].heapIndex;
        VmaAddDetailedStatistics(pStats->memoryHeap[memHeapIndex], pStats->memoryType[memTypeIndex]);
    }

    // Sum from memory heaps to total.
    for(uint32_t memHeapIndex = 0; memHeapIndex < GetMemoryHeapCount(); ++memHeapIndex)
        VmaAddDetailedStatistics(pStats->total, pStats->memoryHeap[memHeapIndex]);

    VMA_ASSERT(pStats->total.statistics.allocationCount == 0 ||
        pStats->total.allocationSizeMax >= pStats->total.allocationSizeMin);
    VMA_ASSERT(pStats->total.unusedRangeCount == 0 ||
        pStats->total.unusedRangeSizeMax >= pStats->total.unusedRangeSizeMin);
}